

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

int __thiscall TPZCheckMesh::CheckConnectSeqNumberConsistency(TPZCheckMesh *this)

{
  long lVar1;
  uint uVar2;
  TPZConnect *pTVar3;
  ostream *poVar4;
  ulong uVar5;
  int64_t ic;
  byte bVar6;
  long lVar7;
  long lVar8;
  
  lVar1 = (this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  if (lVar1 < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar7);
      uVar5 = 0;
      if (pTVar3->fNElConnected != 0) {
        uVar5 = (ulong)(pTVar3->field_2).fCompose.fIsCondensed ^ 1;
      }
      if (pTVar3->fDependList != (TPZDepend *)0x0) {
        uVar5 = 0;
      }
      lVar8 = lVar8 + uVar5;
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
  }
  uVar2 = 0;
  if (0 < lVar1 && lVar8 != 0) {
    bVar6 = 0;
    lVar7 = 0;
    do {
      pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar7);
      if ((((pTVar3->fDependList != (TPZDepend *)0x0) || (pTVar3->fNElConnected == 0)) ||
          ((pTVar3->field_2).fCompose.fIsCondensed == true)) &&
         (pTVar3->fSequenceNumber != -1 && pTVar3->fSequenceNumber < lVar8)) {
        poVar4 = this->fOut;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Connect index ",0xe);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," has inconsistent sequence number ",0x22);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," nindependent connects ",0x17);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        bVar6 = 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
    uVar2 = (uint)bVar6;
  }
  return uVar2;
}

Assistant:

int TPZCheckMesh::CheckConnectSeqNumberConsistency()
{
    bool wrong = false;
    int64_t numindepconnect = 0;
    int64_t nconnect = fMesh->NConnects();
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (!c.HasDependency() && c.NElConnected() && !c.IsCondensed()) {
            numindepconnect++;
        }
    }
    if (numindepconnect == 0) {
        return 0;
    }
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (c.HasDependency() || !c.NElConnected() || c.IsCondensed()) {
            int64_t seqnum = c.SequenceNumber();
            if (seqnum < numindepconnect && seqnum != -1) { // @omar need more information about this case seqnum != -1
                *fOut << "Connect index " << ic << " has inconsistent sequence number " << seqnum << " nindependent connects " << numindepconnect << std::endl;
                wrong = true;
            }
        }
    }
    if (wrong == false) {
        return 0;
    }
    else
    {
        return 1;
    }
}